

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedNumbers
          (Parser *this,EnumDescriptorProto *message,LocationRecorder *parent_location)

{
  Parser *pPVar1;
  bool bVar2;
  int iVar3;
  EnumDescriptorProto_EnumReservedRange *pEVar4;
  char *error;
  int iVar5;
  int end;
  Parser *local_c0;
  uint local_b8;
  int start;
  LocationRecorder *local_b0;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *local_a8;
  EnumDescriptorProto *local_a0;
  LocationRecorder start_location;
  Token start_token;
  LocationRecorder location;
  
  local_a8 = &message->reserved_range_;
  local_b8 = (uint)CONCAT71((int7)((ulong)local_a8 >> 8),1);
  local_c0 = this;
  local_b0 = parent_location;
  local_a0 = message;
  do {
    LocationRecorder::LocationRecorder
              (&location,local_b0,
               (local_a0->reserved_range_).super_RepeatedPtrFieldBase.current_size_);
    pEVar4 = RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::Add
                       (local_a8);
    start_token.text._M_dataplus._M_p = (pointer)&start_token.text.field_2;
    start_token.text._M_string_length = 0;
    start_token.text.field_2._M_local_buf[0] = '\0';
    LocationRecorder::LocationRecorder(&start_location,&location,1);
    pPVar1 = local_c0;
    io::Tokenizer::Token::operator=(&start_token,&local_c0->input_->current_);
    error = "Expected enum number range.";
    if ((local_b8 & 1) != 0) {
      error = "Expected enum value or number range.";
    }
    bVar2 = ConsumeSignedInteger(pPVar1,&start,error);
    LocationRecorder::~LocationRecorder(&start_location);
    if (bVar2) {
      bVar2 = TryConsume(local_c0,"to");
      if (bVar2) {
        LocationRecorder::LocationRecorder(&start_location,&location,2);
        bVar2 = TryConsume(local_c0,"max");
        if (bVar2) {
          end = 0x7fffffff;
        }
        else {
          bVar2 = ConsumeSignedInteger(local_c0,&end,"Expected integer.");
          if (!bVar2) {
            LocationRecorder::~LocationRecorder(&start_location);
            bVar2 = false;
            goto LAB_00352912;
          }
        }
        iVar5 = end;
        LocationRecorder::~LocationRecorder(&start_location);
        iVar3 = start;
      }
      else {
        LocationRecorder::LocationRecorder(&start_location,&location,2);
        LocationRecorder::StartAt(&start_location,&start_token);
        LocationRecorder::EndAt(&start_location,&start_token);
        iVar5 = start;
        end = start;
        LocationRecorder::~LocationRecorder(&start_location);
        iVar3 = iVar5;
      }
      pEVar4->start_ = iVar3;
      *(byte *)(pEVar4->_has_bits_).has_bits_ = (byte)(pEVar4->_has_bits_).has_bits_[0] | 3;
      pEVar4->end_ = iVar5;
      bVar2 = true;
      local_b8 = 0;
    }
    else {
      bVar2 = false;
    }
LAB_00352912:
    std::__cxx11::string::~string((string *)&start_token.text);
    LocationRecorder::~LocationRecorder(&location);
    pPVar1 = local_c0;
    if (!bVar2) {
      return false;
    }
    bVar2 = TryConsume(local_c0,",");
    if (!bVar2) {
      bVar2 = ConsumeEndOfDeclaration(pPVar1,";",local_b0);
      return bVar2;
    }
  } while( true );
}

Assistant:

bool Parser::ParseReservedNumbers(EnumDescriptorProto* message,
                                  const LocationRecorder& parent_location) {
  bool first = true;
  do {
    LocationRecorder location(parent_location, message->reserved_range_size());

    EnumDescriptorProto::EnumReservedRange* range =
        message->add_reserved_range();
    int start, end;
    io::Tokenizer::Token start_token;
    {
      LocationRecorder start_location(
          location, EnumDescriptorProto::EnumReservedRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeSignedInteger(&start,
                              (first ? "Expected enum value or number range."
                                     : "Expected enum number range.")));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, EnumDescriptorProto::EnumReservedRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // This is in the enum descriptor path, which doesn't have the message
        // set duality to fix up, so it doesn't integrate with the sentinel.
        end = INT_MAX;
      } else {
        DO(ConsumeSignedInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, EnumDescriptorProto::EnumReservedRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    range->set_start(start);
    range->set_end(end);
    first = false;
  } while (TryConsume(","));

  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}